

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall google::protobuf::UninterpretedOption::IsInitialized(UninterpretedOption *this)

{
  bool bVar1;
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *t;
  UninterpretedOption *this_local;
  
  t = name(this);
  bVar1 = internal::
          AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>>
                    (t);
  return bVar1;
}

Assistant:

bool UninterpretedOption::IsInitialized() const {
  if (!::google::protobuf::internal::AllAreInitialized(this->name())) return false;
  return true;
}